

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CursorImpl.cpp
# Opt level: O0

bool __thiscall sf::priv::CursorImpl::loadFromSystem(CursorImpl *this,Type type)

{
  undefined8 uVar1;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  uint shape;
  CursorImpl *in_stack_ffffffffffffffe0;
  undefined4 local_18;
  
  release(in_stack_ffffffffffffffe0);
  switch(in_ESI) {
  case 0:
    local_18 = 2;
    break;
  default:
    return false;
  case 2:
    local_18 = 0x96;
    break;
  case 3:
    local_18 = 0x98;
    break;
  case 4:
    local_18 = 0x3c;
    break;
  case 5:
    local_18 = 0x6c;
    break;
  case 6:
    local_18 = 0x74;
    break;
  case 9:
    local_18 = 0x46;
    break;
  case 10:
    local_18 = 0x60;
    break;
  case 0xb:
    local_18 = 0x8a;
    break;
  case 0xc:
    local_18 = 0x10;
    break;
  case 0xd:
    local_18 = 0x86;
    break;
  case 0xe:
    local_18 = 0xe;
    break;
  case 0xf:
    local_18 = 0xc;
    break;
  case 0x10:
    local_18 = 0x88;
    break;
  case 0x11:
    local_18 = 0x34;
    break;
  case 0x12:
    local_18 = 0x22;
    break;
  case 0x13:
    local_18 = 0x5c;
    break;
  case 0x14:
    local_18 = 0;
  }
  uVar1 = XCreateFontCursor(*in_RDI,local_18);
  in_RDI[1] = uVar1;
  return true;
}

Assistant:

bool CursorImpl::loadFromSystem(Cursor::Type type)
{
    release();

    unsigned int shape;
    switch (type)
    {
        default: return false;

        case Cursor::Arrow:           shape = XC_arrow;               break;
        case Cursor::Wait:            shape = XC_watch;               break;
        case Cursor::Text:            shape = XC_xterm;               break;
        case Cursor::Hand:            shape = XC_hand2;               break;
        case Cursor::SizeHorizontal:  shape = XC_sb_h_double_arrow;   break;
        case Cursor::SizeVertical:    shape = XC_sb_v_double_arrow;   break;
        case Cursor::SizeLeft:        shape = XC_left_side;           break;
        case Cursor::SizeRight:       shape = XC_right_side;          break;
        case Cursor::SizeTop:         shape = XC_top_side;            break;
        case Cursor::SizeBottom:      shape = XC_bottom_side;         break;
        case Cursor::SizeTopLeft:     shape = XC_top_left_corner;     break;
        case Cursor::SizeBottomRight: shape = XC_bottom_right_corner; break;
        case Cursor::SizeBottomLeft:  shape = XC_bottom_left_corner;  break;
        case Cursor::SizeTopRight:    shape = XC_top_right_corner;    break;
        case Cursor::SizeAll:         shape = XC_fleur;               break;
        case Cursor::Cross:           shape = XC_crosshair;           break;
        case Cursor::Help:            shape = XC_question_arrow;      break;
        case Cursor::NotAllowed:      shape = XC_X_cursor;            break;
    }

    m_cursor = XCreateFontCursor(m_display, shape);
    return true;
}